

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O1

int mk_fifo_queue_id_destroy(mk_fifo *ctx,int id)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  mk_list *pmVar4;
  mk_list **__ptr;
  
  pmVar4 = (ctx->queues).next;
  __ptr = (mk_list **)0x0;
  do {
    if (pmVar4 == &ctx->queues) {
LAB_001103e2:
      if (__ptr == (mk_list **)0x0) {
        iVar3 = -1;
      }
      else {
        lVar1 = (long)__ptr[3];
        plVar2 = (long *)__ptr[4];
        *(long **)(lVar1 + 8) = plVar2;
        *plVar2 = lVar1;
        __ptr[3] = (mk_list *)0x0;
        __ptr[4] = (mk_list *)0x0;
        free(__ptr);
        iVar3 = 0;
      }
      return iVar3;
    }
    if ((uint)*(ushort *)&pmVar4[-2].next == id) {
      __ptr = &pmVar4[-2].next;
      goto LAB_001103e2;
    }
    pmVar4 = pmVar4->next;
  } while( true );
}

Assistant:

int mk_fifo_queue_id_destroy(struct mk_fifo *ctx, int id)
{
    struct mk_fifo_queue *q;

    q = mk_fifo_queue_get(ctx, id);
    if (!q) {
        return -1;
    }

    mk_fifo_queue_destroy(ctx, q);
    return 0;
}